

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

PClass * __thiscall PClass::CreateDerivedClass(PClass *this,FName *name,uint size)

{
  uint32 *puVar1;
  bool bVar2;
  uint uVar3;
  PClassActor *oldtype;
  PClass *pPVar4;
  PClass *existclass;
  size_t bucket;
  FName local_34;
  PClassActor *local_30;
  
  if (size < *(uint *)((long)&(this->super_PNativeStruct).super_PStruct.super_PNamedType.
                              super_PCompoundType.super_PType.super_PTypeBase.super_DObject + 0x24))
  {
    __assert_fail("size >= Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobjtype.cpp"
                  ,0xccf,"PClass *PClass::CreateDerivedClass(FName, unsigned int)");
  }
  oldtype = (PClassActor *)
            FTypeTable::FindType(&TypeTable,RegistrationInfo.MyClass,0,(long)name->Index,&bucket);
  existclass = (PClass *)oldtype;
  if (oldtype != (PClassActor *)0x0) {
    if (*(int *)((long)&(oldtype->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                        super_PCompoundType.super_PType.super_PTypeBase.super_DObject + 0x24) != -1)
    {
      return (PClass *)0x0;
    }
    bVar2 = IsAncestorOf((oldtype->super_PClass).ParentClass,this);
    if (!bVar2) {
      I_Error("%s must inherit from %s but doesn\'t.",FName::NameData.NameArray[name->Index].Text,
              FName::NameData.NameArray
              [(((oldtype->super_PClass).ParentClass)->super_PNativeStruct).super_PStruct.
               super_PNamedType.TypeName.Index].Text);
    }
    if ((size == 0xffffffff) && ((oldtype->super_PClass).ParentClass == this)) {
      puVar1 = (uint32 *)
               ((long)&(oldtype->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                       super_PCompoundType.super_PType.super_PTypeBase.super_DObject + 0x20);
      *puVar1 = *puVar1 & 0x800;
      return &oldtype->super_PClass;
    }
  }
  pPVar4 = DObject::GetClass((DObject *)this);
  pPVar4 = (PClass *)CreateNew(pPVar4);
  local_34 = (FName)name->Index;
  Derive(this,pPVar4,&local_34);
  *(uint *)((long)&(pPVar4->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.
                   super_PType.super_PTypeBase.super_DObject + 0x24) = size;
  if (size != 0xffffffff) {
    InitializeDefaults(pPVar4);
    TArray<VMFunction_*,_VMFunction_*>::operator=(&pPVar4->Virtuals,&this->Virtuals);
    (**(code **)(*(long *)&(this->super_PNativeStruct).super_PStruct.super_PNamedType.
                           super_PCompoundType.super_PType.super_PTypeBase.super_DObject + 0xb8))
              (this,pPVar4);
  }
  if (oldtype == (PClassActor *)0x0) {
    InsertIntoHash(pPVar4);
  }
  else {
    FTypeTable::ReplaceType(&TypeTable,(PType *)pPVar4,(PType *)oldtype,bucket);
    DObject::StaticPointerSubstitution((DObject *)oldtype,(DObject *)pPVar4,true);
    local_30 = oldtype;
    uVar3 = TArray<PClassActor_*,_PClassActor_*>::Find(&PClassActor::AllActorClasses,&local_30);
    if (uVar3 < PClassActor::AllActorClasses.Count) {
      TArray<PClassActor_*,_PClassActor_*>::Delete(&PClassActor::AllActorClasses,uVar3);
    }
    uVar3 = TArray<PClass_*,_PClass_*>::Find(&AllClasses,&existclass);
    if (uVar3 < AllClasses.Count) {
      TArray<PClass_*,_PClass_*>::Delete(&AllClasses,uVar3);
    }
    (**(code **)(*(long *)&(existclass->super_PNativeStruct).super_PStruct.super_PNamedType.
                           super_PCompoundType.super_PType.super_PTypeBase.super_DObject + 0x20))();
  }
  return pPVar4;
}

Assistant:

PClass *PClass::CreateDerivedClass(FName name, unsigned int size)
{
	assert (size >= Size);
	PClass *type;
	bool notnew;
	size_t bucket;

	PClass *existclass = static_cast<PClass *>(TypeTable.FindType(RUNTIME_CLASS(PClass), /*FIXME:Outer*/0, name, &bucket));

	// This is a placeholder so fill it in
	if (existclass != nullptr)
	{
		if (existclass->Size == TentativeClass)
		{
			if (!IsDescendantOf(existclass->ParentClass))
			{
				I_Error("%s must inherit from %s but doesn't.", name.GetChars(), existclass->ParentClass->TypeName.GetChars());
			}

			if (size == TentativeClass)
			{
				// see if we can reuse the existing class. This is only possible if the inheritance is identical. Otherwise it needs to be replaced.
				if (this == existclass->ParentClass)
				{
					existclass->ObjectFlags &= OF_Transient;
					return existclass;
				}
			}
			notnew = true;
		}
		else
		{
			// a different class with the same name already exists. Let the calling code deal with this.
			return nullptr;
		}
	}
	else
	{
		notnew = false;
	}

	// Create a new type object of the same type as us. (We may be a derived class of PClass.)
	type = static_cast<PClass *>(GetClass()->CreateNew());

	Derive(type, name);
	type->Size = size;
	if (size != TentativeClass)
	{
		type->InitializeDefaults();
		type->Virtuals = Virtuals;
		DeriveData(type);
	}
	if (!notnew)
	{
		type->InsertIntoHash();
	}
	else
	{
		TypeTable.ReplaceType(type, existclass, bucket);
		StaticPointerSubstitution(existclass, type, true);	// replace the old one, also in the actor defaults.
		// Delete the old class from the class lists, both the full one and the actor list.
		auto index = PClassActor::AllActorClasses.Find(static_cast<PClassActor*>(existclass));
		if (index < PClassActor::AllActorClasses.Size()) PClassActor::AllActorClasses.Delete(index);
		index = PClass::AllClasses.Find(existclass);
		if (index < PClass::AllClasses.Size()) PClass::AllClasses.Delete(index);
		// Now we can destroy the old class as nothing should reference it anymore
		existclass->Destroy();
	}
	return type;
}